

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

Port * __thiscall
kratos::Generator::port(Generator *this,PortPackedStruct *port,string *port_name,bool check_param)

{
  undefined7 in_register_00000009;
  shared_ptr<kratos::PackedStruct> local_68;
  PortDirection local_54;
  Generator *local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::PortPackedStruct> p;
  
  p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = (undefined4)CONCAT71(in_register_00000009,check_param);
  local_54 = (port->super_Port).direction_;
  local_50 = this;
  (*(port->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])(&local_68);
  std::__shared_ptr<kratos::PortPackedStruct,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::PortPackedStruct>,kratos::Generator*,kratos::PortDirection,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>>
            ((__shared_ptr<kratos::PortPackedStruct,(__gnu_cxx::_Lock_policy)2> *)local_48,
             (allocator<kratos::PortPackedStruct> *)
             ((long)&p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),&local_50,&local_54,port_name,&local_68);
  if (local_68.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)local_48);
  Var::copy_meta_data((Var *)port,(Var *)local_48,
                      p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_1_);
  if (p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return &((element_type *)local_48)->super_Port;
}

Assistant:

Port &Generator::port(const PortPackedStruct &port, const std::string &port_name,
                      bool check_param) {
    auto p = std::make_shared<PortPackedStruct>(this, port.port_direction(), port_name,
                                                port.packed_struct());
    add_port_name(port_name);
    vars_.emplace(port_name, p);

    port.copy_meta_data(p.get(), check_param);

    return *p;
}